

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkTestResult
          (TestStatus *__return_storage_ptr__,BlittingImages *this,ConstPixelBufferAccess *result)

{
  ChannelType type;
  bool bVar1;
  ConstPixelBufferAccess depthResult;
  TextureFormat sourceFormat;
  ConstPixelBufferAccess unclampedExpected;
  string failMessage;
  ConstPixelBufferAccess clampedExpected;
  PixelBufferAccess local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failMessage,"Result image is incorrect",(allocator<char> *)&depthResult);
  type = (result->m_format).type;
  if ((this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter == VK_FILTER_LINEAR) {
    bVar1 = tcu::isCombinedDepthStencilType(type);
    if (bVar1) {
      bVar1 = tcu::hasDepthComponent((result->m_format).order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess(&depthResult,result,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&sourceFormat,
                   (this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&unclampedExpected,(PixelBufferAccess *)&sourceFormat,
                   MODE_DEPTH);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&clampedExpected,&unclampedExpected);
        tcu::TextureLevel::getAccess
                  (&local_40,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&sourceFormat,&local_40,MODE_DEPTH)
        ;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&unclampedExpected,(ConstPixelBufferAccess *)&sourceFormat);
        local_40.super_ConstPixelBufferAccess.m_format =
             ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format
                              );
        sourceFormat = tcu::getEffectiveDepthStencilTextureFormat
                                 ((TextureFormat *)&local_40,MODE_DEPTH);
        bVar1 = checkLinearFilteredResult
                          (this,&depthResult,&clampedExpected,&unclampedExpected,&sourceFormat);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,&failMessage);
          goto LAB_004c4866;
        }
      }
      bVar1 = tcu::hasStencilComponent((result->m_format).order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess(&depthResult,result,MODE_STENCIL);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&sourceFormat,
                   (this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&unclampedExpected,(PixelBufferAccess *)&sourceFormat,
                   MODE_STENCIL);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&clampedExpected,&unclampedExpected);
        tcu::TextureLevel::getAccess
                  (&local_40,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&sourceFormat,&local_40,MODE_STENCIL);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&unclampedExpected,(ConstPixelBufferAccess *)&sourceFormat);
        local_40.super_ConstPixelBufferAccess.m_format =
             ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format
                              );
        sourceFormat = tcu::getEffectiveDepthStencilTextureFormat
                                 ((TextureFormat *)&local_40,MODE_STENCIL);
        bVar1 = checkLinearFilteredResult
                          (this,&depthResult,&clampedExpected,&unclampedExpected,&sourceFormat);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,&failMessage);
          goto LAB_004c4866;
        }
      }
    }
    else {
      unclampedExpected.m_format =
           ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&depthResult,
                 (this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                 super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
                 ptr);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&clampedExpected,
                 (this->m_unclampedExpectedTextureLevel).
                 super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
                 ptr);
      bVar1 = checkLinearFilteredResult
                        (this,result,&depthResult,&clampedExpected,&unclampedExpected.m_format);
      if (!bVar1) {
        tcu::TestStatus::fail(__return_storage_ptr__,&failMessage);
        goto LAB_004c4866;
      }
    }
  }
  else {
    bVar1 = tcu::isCombinedDepthStencilType(type);
    if (bVar1) {
      bVar1 = tcu::hasDepthComponent((result->m_format).order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess(&depthResult,result,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&sourceFormat,
                   (this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&unclampedExpected,(PixelBufferAccess *)&sourceFormat,
                   MODE_DEPTH);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&clampedExpected,&unclampedExpected);
        bVar1 = checkNearestFilteredResult(this,&depthResult,&clampedExpected);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,&failMessage);
          goto LAB_004c4866;
        }
      }
      bVar1 = tcu::hasStencilComponent((result->m_format).order);
      if (bVar1) {
        tcu::getEffectiveDepthStencilAccess(&depthResult,result,MODE_STENCIL);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&sourceFormat,
                   (this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&unclampedExpected,(PixelBufferAccess *)&sourceFormat,
                   MODE_STENCIL);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&clampedExpected,&unclampedExpected);
        bVar1 = checkNearestFilteredResult(this,&depthResult,&clampedExpected);
        if (!bVar1) {
          tcu::TestStatus::fail(__return_storage_ptr__,&failMessage);
          goto LAB_004c4866;
        }
      }
    }
    else {
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&depthResult,
                 (this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                 super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
                 ptr);
      bVar1 = checkNearestFilteredResult(this,result,&depthResult);
      if (!bVar1) {
        tcu::TestStatus::fail(__return_storage_ptr__,&failMessage);
        goto LAB_004c4866;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depthResult,"Pass",(allocator<char> *)&clampedExpected);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&depthResult);
  std::__cxx11::string::~string((string *)&depthResult);
LAB_004c4866:
  std::__cxx11::string::~string((string *)&failMessage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BlittingImages::checkTestResult (tcu::ConstPixelBufferAccess result)
{
	DE_ASSERT(m_params.filter == VK_FILTER_NEAREST || m_params.filter == VK_FILTER_LINEAR);
	const std::string failMessage("Result image is incorrect");

	if (m_params.filter == VK_FILTER_LINEAR)
	{
		if (tcu::isCombinedDepthStencilType(result.getFormat().type))
		{
			if (tcu::hasDepthComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode				= tcu::Sampler::MODE_DEPTH;
				const tcu::ConstPixelBufferAccess		depthResult			= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		clampedExpected		= tcu::getEffectiveDepthStencilAccess(m_expectedTextureLevel->getAccess(), mode);
				const tcu::ConstPixelBufferAccess		unclampedExpected	= tcu::getEffectiveDepthStencilAccess(m_unclampedExpectedTextureLevel->getAccess(), mode);
				const tcu::TextureFormat				sourceFormat		= tcu::getEffectiveDepthStencilTextureFormat(mapVkFormat(m_params.src.image.format), mode);

				if (!checkLinearFilteredResult(depthResult, clampedExpected, unclampedExpected, sourceFormat))
					return tcu::TestStatus::fail(failMessage);
			}

			if (tcu::hasStencilComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode				= tcu::Sampler::MODE_STENCIL;
				const tcu::ConstPixelBufferAccess		stencilResult		= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		clampedExpected		= tcu::getEffectiveDepthStencilAccess(m_expectedTextureLevel->getAccess(), mode);
				const tcu::ConstPixelBufferAccess		unclampedExpected	= tcu::getEffectiveDepthStencilAccess(m_unclampedExpectedTextureLevel->getAccess(), mode);
				const tcu::TextureFormat				sourceFormat		= tcu::getEffectiveDepthStencilTextureFormat(mapVkFormat(m_params.src.image.format), mode);

				if (!checkLinearFilteredResult(stencilResult, clampedExpected, unclampedExpected, sourceFormat))
					return tcu::TestStatus::fail(failMessage);
			}
		}
		else
		{
			const tcu::TextureFormat	sourceFormat	= mapVkFormat(m_params.src.image.format);

			if (!checkLinearFilteredResult(result, m_expectedTextureLevel->getAccess(), m_unclampedExpectedTextureLevel->getAccess(), sourceFormat))
				return tcu::TestStatus::fail(failMessage);
		}
	}
	else // NEAREST filtering
	{
		if (tcu::isCombinedDepthStencilType(result.getFormat().type))
		{
			if (tcu::hasDepthComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode			= tcu::Sampler::MODE_DEPTH;
				const tcu::ConstPixelBufferAccess		depthResult		= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		depthSource		= tcu::getEffectiveDepthStencilAccess(m_sourceTextureLevel->getAccess(), mode);

				if (!checkNearestFilteredResult(depthResult, depthSource))
					return tcu::TestStatus::fail(failMessage);
			}

			if (tcu::hasStencilComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode			= tcu::Sampler::MODE_STENCIL;
				const tcu::ConstPixelBufferAccess		stencilResult	= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		stencilSource	= tcu::getEffectiveDepthStencilAccess(m_sourceTextureLevel->getAccess(), mode);

				if (!checkNearestFilteredResult(stencilResult, stencilSource))
					return tcu::TestStatus::fail(failMessage);
			}
		}
		else
		{
			if (!checkNearestFilteredResult(result, m_sourceTextureLevel->getAccess()))
				return tcu::TestStatus::fail(failMessage);
		}
	}

	return tcu::TestStatus::pass("Pass");
}